

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O2

void ncnn::gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  undefined4 uVar14;
  Mat *pMVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int *piVar25;
  uint unaff_R15D;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int iVar32;
  float fVar39;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar40;
  int iVar41;
  int iVar42;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar43;
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  long local_88;
  
  uVar18 = grid->h * grid->w * grid->d;
  piVar25 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    sVar8 = grid->cstep;
    sVar9 = grid->elemsize;
    local_88 = (long)grid->data + 8;
    for (lVar11 = 0; lVar11 < grid->c; lVar11 = lVar11 + 1) {
      pMVar15 = grid;
      for (lVar13 = 0; iVar23 = -1, uVar14 = SUB84(pMVar15,0), (int)lVar13 < (int)uVar18;
          lVar13 = lVar13 + 3) {
        iVar22 = src->d;
        fVar47 = (float)(iVar22 + -1) * (*(float *)(local_88 + lVar13 * 4) * 0.5 + 0.5);
        uVar4 = *(undefined8 *)(local_88 + -8 + lVar13 * 4);
        uVar3 = src->w;
        uVar6 = src->h;
        fVar29 = (float)(uVar3 + -1) * ((float)uVar4 * 0.5 + 0.5);
        fVar39 = (float)(uVar6 + -1) * ((float)((ulong)uVar4 >> 0x20) * 0.5 + 0.5);
        fVar30 = floorf(fVar29);
        fVar31 = floorf(fVar39);
        iVar32 = (int)fVar30;
        iVar40 = (int)fVar31;
        iVar41 = (int)extraout_XMM0_Db_01;
        iVar42 = (int)extraout_XMM0_Db_02;
        fVar30 = floorf(fVar47);
        iVar10 = (int)fVar30;
        iVar1 = iVar10 + 1;
        bVar16 = iVar10 < iVar22 && -1 < iVar10;
        auVar36._0_4_ = -(uint)(-1 < iVar32);
        auVar36._4_4_ = -(uint)(-1 < iVar40);
        auVar36._8_4_ = -(uint)(-1 < iVar41);
        auVar36._12_4_ = -(uint)(-1 < iVar42);
        auVar45._0_4_ = -(uint)(iVar32 < (int)uVar3);
        auVar45._4_4_ = -(uint)(iVar40 < (int)uVar6);
        auVar45._8_4_ = -(uint)(iVar41 < 0);
        auVar45._12_4_ = -(uint)(iVar42 < 0);
        auVar45 = auVar45 & auVar36;
        auVar37._0_8_ = auVar45._0_8_;
        auVar37._8_4_ = auVar45._4_4_;
        auVar37._12_4_ = auVar45._12_4_;
        auVar38._0_8_ = auVar37._0_8_ << 0x3f;
        auVar38._8_8_ = auVar37._8_8_ << 0x3f;
        uVar24 = movmskpd(uVar14,auVar38);
        uVar20 = uVar24 >> 1 & 0x7f;
        uVar26 = uVar20 & uVar24 & 1;
        uVar19 = (uint)bVar16;
        iVar17 = iVar23;
        if ((uVar26 & uVar19) != 0) {
          iVar17 = (uVar3 * (iVar40 + uVar6 * iVar10) + iVar32) * src->elempack;
        }
        iVar43 = iVar32 + 1;
        iVar46 = iVar40 + 1;
        auVar51._0_4_ = -(uint)(-2 < iVar32);
        auVar51._4_4_ = -(uint)(-2 < iVar40);
        auVar51._8_4_ = -(uint)(0 < iVar41);
        auVar51._12_4_ = -(uint)(0 < iVar42);
        auVar55._0_4_ = -(uint)(iVar43 < (int)uVar3);
        auVar55._4_4_ = -(uint)(iVar46 < (int)uVar6);
        auVar55._8_4_ = -(uint)(iVar41 + 1 < 0);
        auVar55._12_4_ = -(uint)(iVar42 + 1 < 0);
        auVar55 = auVar55 & auVar51;
        auVar52._0_8_ = auVar55._0_8_;
        auVar52._8_4_ = auVar55._4_4_;
        auVar52._12_4_ = auVar55._12_4_;
        auVar53._0_8_ = auVar52._0_8_ << 0x3f;
        auVar53._8_8_ = auVar52._8_8_ << 0x3f;
        uVar27 = movmskpd(unaff_R15D,auVar53);
        uVar20 = uVar20 & uVar27 & 1;
        *piVar25 = iVar17;
        if ((uVar20 & uVar19) != 0) {
          iVar23 = ((iVar40 + src->h * iVar10) * src->w + iVar43) * src->elempack;
        }
        iVar17 = -1;
        uVar28 = uVar27 >> 1 & 0x7f;
        uVar24 = uVar24 & 1 & uVar28;
        piVar25[1] = iVar23;
        uVar19 = (uint)bVar16;
        if ((uVar24 & uVar19) != 0) {
          iVar17 = ((iVar46 + src->h * iVar10) * src->w + iVar32) * src->elempack;
        }
        unaff_R15D = uVar28 & uVar27 & 1;
        piVar25[2] = iVar17;
        iVar17 = -1;
        iVar23 = iVar17;
        if ((unaff_R15D & uVar19) != 0) {
          iVar23 = ((iVar46 + src->h * iVar10) * src->w + iVar43) * src->elempack;
        }
        bVar16 = -2 < iVar10 && iVar1 < iVar22;
        piVar25[3] = iVar23;
        uVar19 = (uint)bVar16;
        iVar23 = iVar17;
        if ((uVar26 & uVar19) != 0) {
          iVar23 = ((iVar40 + src->h * iVar1) * src->w + iVar32) * src->elempack;
        }
        piVar25[4] = iVar23;
        iVar23 = iVar17;
        if ((uVar20 & uVar19) != 0) {
          iVar23 = ((iVar40 + src->h * iVar1) * src->w + iVar43) * src->elempack;
        }
        piVar25[5] = iVar23;
        uVar19 = (uint)bVar16;
        iVar23 = iVar17;
        if ((uVar24 & uVar19) != 0) {
          uVar24 = src->h * iVar1;
          iVar23 = ((iVar46 + uVar24) * src->w + iVar32) * src->elempack;
        }
        pMVar15 = (Mat *)(ulong)uVar24;
        piVar25[6] = iVar23;
        if ((unaff_R15D & uVar19) != 0) {
          iVar17 = ((iVar46 + iVar1 * src->h) * src->w + iVar43) * src->elempack;
        }
        piVar25[7] = iVar17;
        *(ulong *)(piVar25 + 8) = CONCAT44(fVar39 - (float)iVar40,fVar29 - (float)iVar32);
        piVar25[10] = (int)(fVar47 - (float)iVar10);
        piVar25 = piVar25 + 0xb;
      }
      local_88 = local_88 + sVar8 * sVar9;
    }
  }
  else {
    lVar11 = grid->elemsize * grid->cstep;
    pvVar7 = grid->data;
    uVar12 = 0;
    uVar21 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar21 = uVar12;
    }
    iVar23 = -1;
    for (; uVar14 = SUB84(grid,0), (int)uVar21 != (int)uVar12; uVar12 = uVar12 + 1) {
      iVar22 = src->d;
      fVar47 = (float)(iVar22 + -1) *
               (*(float *)((long)pvVar7 + uVar12 * 4 + lVar11 * 2) * 0.5 + 0.5);
      uVar2 = src->w;
      uVar5 = src->h;
      fVar29 = (float)(uVar2 + -1) * (*(float *)((long)pvVar7 + uVar12 * 4) * 0.5 + 0.5);
      fVar39 = (float)(uVar5 + -1) * (*(float *)((long)pvVar7 + uVar12 * 4 + lVar11) * 0.5 + 0.5);
      fVar30 = floorf(fVar29);
      fVar31 = floorf(fVar39);
      iVar32 = (int)fVar30;
      iVar40 = (int)fVar31;
      iVar41 = (int)extraout_XMM0_Db;
      iVar42 = (int)extraout_XMM0_Db_00;
      fVar30 = floorf(fVar47);
      iVar10 = (int)fVar30;
      iVar1 = iVar10 + 1;
      bVar16 = iVar10 < iVar22 && -1 < iVar10;
      auVar33._0_4_ = -(uint)(-1 < iVar32);
      auVar33._4_4_ = -(uint)(-1 < iVar40);
      auVar33._8_4_ = -(uint)(-1 < iVar41);
      auVar33._12_4_ = -(uint)(-1 < iVar42);
      auVar44._0_4_ = -(uint)(iVar32 < (int)uVar2);
      auVar44._4_4_ = -(uint)(iVar40 < (int)uVar5);
      auVar44._8_4_ = -(uint)(iVar41 < 0);
      auVar44._12_4_ = -(uint)(iVar42 < 0);
      auVar44 = auVar44 & auVar33;
      auVar34._0_8_ = auVar44._0_8_;
      auVar34._8_4_ = auVar44._4_4_;
      auVar34._12_4_ = auVar44._12_4_;
      auVar35._0_8_ = auVar34._0_8_ << 0x3f;
      auVar35._8_8_ = auVar34._8_8_ << 0x3f;
      uVar18 = movmskpd(uVar14,auVar35);
      uVar19 = uVar18 >> 1 & 0x7f;
      uVar24 = uVar19 & uVar18 & 1;
      uVar20 = (uint)bVar16;
      iVar17 = iVar23;
      if ((uVar24 & uVar20) != 0) {
        iVar17 = (uVar2 * (iVar40 + uVar5 * iVar10) + iVar32) * src->elempack;
      }
      iVar43 = iVar32 + 1;
      iVar46 = iVar40 + 1;
      auVar48._0_4_ = -(uint)(-2 < iVar32);
      auVar48._4_4_ = -(uint)(-2 < iVar40);
      auVar48._8_4_ = -(uint)(0 < iVar41);
      auVar48._12_4_ = -(uint)(0 < iVar42);
      auVar54._0_4_ = -(uint)(iVar43 < (int)uVar2);
      auVar54._4_4_ = -(uint)(iVar46 < (int)uVar5);
      auVar54._8_4_ = -(uint)(iVar41 + 1 < 0);
      auVar54._12_4_ = -(uint)(iVar42 + 1 < 0);
      auVar54 = auVar54 & auVar48;
      auVar49._0_8_ = auVar54._0_8_;
      auVar49._8_4_ = auVar54._4_4_;
      auVar49._12_4_ = auVar54._12_4_;
      auVar50._0_8_ = auVar49._0_8_ << 0x3f;
      auVar50._8_8_ = auVar49._8_8_ << 0x3f;
      uVar26 = movmskpd(unaff_R15D,auVar50);
      uVar19 = uVar19 & uVar26 & 1;
      *piVar25 = iVar17;
      iVar17 = iVar23;
      if ((uVar19 & uVar20) != 0) {
        iVar17 = ((iVar40 + src->h * iVar10) * src->w + iVar43) * src->elempack;
      }
      uVar27 = uVar26 >> 1 & 0x7f;
      uVar18 = uVar18 & 1 & uVar27;
      grid = (Mat *)(ulong)uVar18;
      piVar25[1] = iVar17;
      uVar20 = (uint)bVar16;
      iVar17 = iVar23;
      if ((uVar18 & uVar20) != 0) {
        iVar17 = ((iVar46 + src->h * iVar10) * src->w + iVar32) * src->elempack;
      }
      unaff_R15D = uVar27 & uVar26 & 1;
      piVar25[2] = iVar17;
      iVar17 = iVar23;
      if ((unaff_R15D & uVar20) != 0) {
        iVar17 = ((iVar46 + src->h * iVar10) * src->w + iVar43) * src->elempack;
      }
      bVar16 = -2 < iVar10 && iVar1 < iVar22;
      piVar25[3] = iVar17;
      uVar20 = (uint)bVar16;
      iVar22 = iVar23;
      if ((uVar24 & uVar20) != 0) {
        iVar22 = ((iVar40 + src->h * iVar1) * src->w + iVar32) * src->elempack;
      }
      piVar25[4] = iVar22;
      iVar22 = iVar23;
      if ((uVar19 & uVar20) != 0) {
        iVar22 = ((iVar40 + src->h * iVar1) * src->w + iVar43) * src->elempack;
      }
      piVar25[5] = iVar22;
      uVar19 = (uint)bVar16;
      iVar22 = iVar23;
      if ((uVar18 & uVar19) != 0) {
        iVar22 = ((iVar46 + src->h * iVar1) * src->w + iVar32) * src->elempack;
      }
      piVar25[6] = iVar22;
      iVar22 = iVar23;
      if ((unaff_R15D & uVar19) != 0) {
        iVar22 = ((iVar46 + iVar1 * src->h) * src->w + iVar43) * src->elempack;
      }
      piVar25[7] = iVar22;
      *(ulong *)(piVar25 + 8) = CONCAT44(fVar39 - (float)iVar40,fVar29 - (float)iVar32);
      piVar25[10] = (int)(fVar47 - (float)iVar10);
      piVar25 = piVar25 + 0xb;
    }
  }
  return;
}

Assistant:

void gridsample_3d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);
                __m256 z_t = _mm256_floor_ps(gz);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
                __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
                __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
                __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

                __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
                {
                    __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                    __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                    __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                    __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                    v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                    v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                    v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                    v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                    v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                    v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                    v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                    v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
                }

                __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                                  _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                                  _mm256_set1_ps(src.elempack));
                __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
                __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

                __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
                __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
                __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

                tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
                tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
                tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
                tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

                bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
                bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
                bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
                bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

                tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
                tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
                tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
                tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

                bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
                bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
                bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
                bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);
                __m256 gamma = _mm256_sub_ps(gz, z_t);

                transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

                _mm256_storeu_ps(offset_value_ptr, tnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
                _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

                _mm256_storeu_ps(offset_value_ptr + 64, alpha);
                _mm256_storeu_ps(offset_value_ptr + 72, beta);
                _mm256_storeu_ps(offset_value_ptr + 80, gamma);

                gridptr += 24;

                offset_value_ptr += 88;
            }
#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int z0 = (int)floorf(sample_z);
                int x1 = x0 + 1;
                int y1 = y0 + 1;
                int z1 = z0 + 1;

                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool y0_in_range = (y0 > -1) & (y0 < src.h);
                bool z0_in_range = (z0 > -1) & (z0 < src.d);
                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool y1_in_range = (y1 > -1) & (y1 < src.h);
                bool z1_in_range = (z1 > -1) & (z1 < src.d);

                bool v00_in_range = x0_in_range & y0_in_range;
                bool v01_in_range = x1_in_range & y0_in_range;
                bool v10_in_range = x0_in_range & y1_in_range;
                bool v11_in_range = x1_in_range & y1_in_range;

                bool in_bound_000 = v00_in_range & z0_in_range;
                bool in_bound_001 = v01_in_range & z0_in_range;
                bool in_bound_010 = v10_in_range & z0_in_range;
                bool in_bound_011 = v11_in_range & z0_in_range;

                bool in_bound_100 = v00_in_range & z1_in_range;
                bool in_bound_101 = v01_in_range & z1_in_range;
                bool in_bound_110 = v10_in_range & z1_in_range;
                bool in_bound_111 = v11_in_range & z1_in_range;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 8;

                offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;
                value_ptr[2] = sample_z - z0;

                gridptr += 3;
                offset_value_ptr += 11;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);
            __m256 z_t = _mm256_floor_ps(gz);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
            __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
            __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
            __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

            __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
            {
                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
            }

            __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                              _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                              _mm256_set1_ps(src.elempack));
            __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
            __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

            __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
            __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
            __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

            tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
            tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
            tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
            tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

            bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
            bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
            bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
            bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

            tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
            tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
            tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
            tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

            bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
            bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
            bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
            bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);
            __m256 gamma = _mm256_sub_ps(gz, z_t);

            transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

            _mm256_storeu_ps(offset_value_ptr, tnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
            _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

            _mm256_storeu_ps(offset_value_ptr + 64, alpha);
            _mm256_storeu_ps(offset_value_ptr + 72, beta);
            _mm256_storeu_ps(offset_value_ptr + 80, gamma);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_value_ptr += 88;
        }
#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int z0 = (int)floorf(sample_z);
            int x1 = x0 + 1;
            int y1 = y0 + 1;
            int z1 = z0 + 1;

            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool y0_in_range = (y0 > -1) & (y0 < src.h);
            bool z0_in_range = (z0 > -1) & (z0 < src.d);
            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool y1_in_range = (y1 > -1) & (y1 < src.h);
            bool z1_in_range = (z1 > -1) & (z1 < src.d);

            bool v00_in_range = x0_in_range & y0_in_range;
            bool v01_in_range = x1_in_range & y0_in_range;
            bool v10_in_range = x0_in_range & y1_in_range;
            bool v11_in_range = x1_in_range & y1_in_range;

            bool in_bound_000 = v00_in_range & z0_in_range;
            bool in_bound_001 = v01_in_range & z0_in_range;
            bool in_bound_010 = v10_in_range & z0_in_range;
            bool in_bound_011 = v11_in_range & z0_in_range;

            bool in_bound_100 = v00_in_range & z1_in_range;
            bool in_bound_101 = v01_in_range & z1_in_range;
            bool in_bound_110 = v10_in_range & z1_in_range;
            bool in_bound_111 = v11_in_range & z1_in_range;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 8;

            offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;
            value_ptr[2] = sample_z - z0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;
            offset_value_ptr += 11;
        }
    }
}